

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O3

void tele_trap(trap *trap)

{
  boolean bVar1;
  char *line;
  
  if ((u.uprops[0x2c].extrinsic == 0 && u.uz.dnum != dungeon_topology.d_astral_level.dnum) &&
     ((u.umonnum == u.umonster || (bVar1 = resists_magm(&youmonst), bVar1 == '\0')))) {
    bVar1 = next_to_u();
    if (bVar1 != '\0') {
      if ((trap->field_0x8 & 0x40) != 0) {
        deltrap(level,trap);
        newsym((int)u.ux,(int)u.uy);
        vault_tele();
        return;
      }
      tele((char *)0x0);
      return;
    }
    line = "You shudder for a moment.";
  }
  else {
    if ((u.uprops[0x2c].extrinsic != 0) ||
       ((u.umonnum != u.umonster && (bVar1 = resists_magm(&youmonst), bVar1 != '\0')))) {
      shieldeff(u.ux,u.uy);
    }
    line = "You feel a wrenching sensation.";
  }
  pline(line);
  return;
}

Assistant:

void tele_trap(struct trap *trap)
{
	if (In_endgame(&u.uz) || Antimagic) {
		if (Antimagic)
			shieldeff(u.ux, u.uy);
		pline("You feel a wrenching sensation.");
	} else if (!next_to_u()) {
		pline("You shudder for a moment.");
	} else if (trap->once) {
		deltrap(level, trap);
		newsym(u.ux,u.uy);	/* get rid of trap symbol */
		vault_tele();
	} else
		tele(NULL);
}